

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# server.c
# Opt level: O2

int main(int argc,char **argv)

{
  char *__name;
  bool bVar1;
  bool bVar2;
  int iVar3;
  int iVar4;
  FILE *__stream;
  size_t sVar5;
  FILE *requestedFile;
  char *pcVar6;
  size_t sStack_1090;
  addrinfo *ai;
  char *local_1070;
  addrinfo local_1068;
  char get [1024];
  char buf [1024];
  char local_838 [1024];
  char path [1024];
  
  fileName = *argv;
  bVar1 = false;
  bVar2 = true;
  pcVar6 = "8080";
  local_1070 = "index.html";
LAB_001024b4:
  while (iVar3 = __posix_getopt(argc,argv,"p:i:"), iVar3 == 0x70) {
    if (bVar1) goto LAB_0010289a;
    pcVar6 = strdup(_optarg);
    iVar3 = isValidPort(pcVar6);
    bVar1 = true;
    if (iVar3 == 0) {
      fprintf(_stderr,"%s ERROR: ",fileName);
      pcVar6 = "INVALID PORT";
      sStack_1090 = 0xc;
LAB_001028ec:
      fwrite(pcVar6,sStack_1090,1,_stderr);
      fputc(10,_stderr);
LAB_00102900:
      exit(1);
    }
  }
  if (iVar3 == 0x69) {
    if (bVar2) {
      local_1070 = strdup(_optarg);
      bVar2 = false;
      goto LAB_001024b4;
    }
  }
  else if ((iVar3 == -1) && (__name = argv[_optind], __name != (char *)0x0)) {
    iVar3 = access(__name,4);
    if (iVar3 == -1) {
      fprintf(_stderr,"%s ERROR: ",fileName);
      pcVar6 = "root doc can\'t be read from";
      sStack_1090 = 0x1b;
      goto LAB_001028ec;
    }
    local_1068.ai_addrlen = 0;
    local_1068._20_4_ = 0;
    local_1068.ai_next = (addrinfo *)0x0;
    local_1068.ai_addr = (sockaddr *)0x0;
    local_1068.ai_canonname = (char *)0x0;
    local_1068.ai_socktype = 1;
    local_1068.ai_protocol = 0;
    local_1068.ai_flags = 1;
    local_1068.ai_family = 2;
    iVar3 = getaddrinfo((char *)0x0,pcVar6,&local_1068,(addrinfo **)&ai);
    if (iVar3 != 0) {
      freeaddrinfo((addrinfo *)ai);
      fprintf(_stderr,"%s ERROR: ",fileName);
      pcVar6 = "getAddressInfo";
      sStack_1090 = 0xe;
      goto LAB_001028ec;
    }
    iVar3 = socket(ai->ai_family,ai->ai_socktype,ai->ai_protocol);
    if (iVar3 < 0) {
      freeaddrinfo((addrinfo *)ai);
      fprintf(_stderr,"%s ERROR: ",fileName);
      pcVar6 = "socket";
    }
    else {
      iVar4 = bind(iVar3,(sockaddr *)ai->ai_addr,ai->ai_addrlen);
      if (iVar4 < 0) {
        freeaddrinfo((addrinfo *)ai);
        fprintf(_stderr,"%s ERROR: ",fileName);
        pcVar6 = "bind";
        sStack_1090 = 4;
        goto LAB_001028ec;
      }
      iVar4 = listen(iVar3,10);
      if (-1 < iVar4) {
        fprintf(_stderr,"http://localhost:%s ...\n",pcVar6);
        memset(buf + 8,0,0x90);
        memset(get + 8,0,0x90);
        buf._0_8_ = signalHandler;
        get._0_8_ = signalHandler;
        iVar4 = sigaction(2,(sigaction *)buf,(sigaction *)0x0);
        if ((iVar4 != 0) || (iVar4 = sigaction(0xf,(sigaction *)get,(sigaction *)0x0), iVar4 != 0))
        {
          fprintf(_stderr,"%s ERROR: ",fileName);
          pcVar6 = "sigaction";
          sStack_1090 = 9;
          goto LAB_001028ec;
        }
        if (terminate == 0) goto LAB_0010266f;
        goto LAB_0010287c;
      }
      freeaddrinfo((addrinfo *)ai);
      fprintf(_stderr,"%s ERROR: ",fileName);
      pcVar6 = "listen";
    }
    sStack_1090 = 6;
    goto LAB_001028ec;
  }
LAB_0010289a:
  fprintf(_stderr,"USAGE:\t%s [-p PORT] [-i INDEX] DOC_ROOT\n",fileName);
  goto LAB_00102900;
  while( true ) {
    __stream = fdopen(iVar4,"r+");
    if (__stream == (FILE *)0x0) {
      fprintf(_stderr,"%s ERROR: ",fileName);
      fwrite("could not open socket",0x15,1,_stderr);
      fputc(10,_stderr);
    }
    else {
      buf._0_8_ = buf._0_8_ & 0xffffffffffffff00;
      get._0_8_ = get._0_8_ & 0xffffffffffffff00;
      path[0] = '\0';
      local_838[0] = '\0';
      fgets(buf,0x400,__stream);
      __isoc99_sscanf(buf,"%[^ ] /%[^ ] HTTP/1.1\r\n",get,path);
      strcat(local_838,__name);
      strcat(local_838,path);
      sVar5 = strlen(local_838);
      if (local_838[sVar5 - 1] == '/') {
        strcat(local_838,local_1070);
      }
      fprintf(_stderr,"GET: %s PATH: %s\n",get,local_838);
      goToEndOfHeader((FILE *)__stream);
      if (get._0_4_ == 0x544547) {
        requestedFile = fopen(local_838,"r+");
        if (requestedFile == (FILE *)0x0) {
          printHeader((FILE *)__stream,0x194,(FILE *)0x0);
          fflush(__stream);
          fclose(__stream);
          close(iVar4);
        }
        else {
          printHeader((FILE *)__stream,200,(FILE *)requestedFile);
          writeFileToFile((FILE *)requestedFile,(FILE *)__stream);
          fflush(__stream);
          fclose(__stream);
          close(iVar4);
          fwrite("finished\n",9,1,_stderr);
        }
      }
      else {
        printHeader((FILE *)__stream,0x1f5,(FILE *)0x0);
        fflush(__stream);
        fclose(__stream);
        close(iVar4);
      }
    }
    if (terminate != 0) break;
LAB_0010266f:
    iVar4 = accept(iVar3,(sockaddr *)0x0,(socklen_t *)0x0);
    if (iVar4 < 0) {
      close(iVar4);
      break;
    }
  }
LAB_0010287c:
  freeaddrinfo((addrinfo *)ai);
  return 0;
}

Assistant:

int main(int argc, char *argv[]) {
	fileName = argv[0];
	int p=0;
	int i = 0;
	char * p_port = "8080";
	char * i_index = "index.html";
	char * rootDoc = "";

	int c;
	while ((c = getopt(argc, argv, "p:i:")) != -1) {
		switch (c) {
		case 'p':if (p) { USAGE(); }
				 p++;
				 p_port = strdup(optarg);
				 if (isValidPort(p_port) == 0) {
					 ERROR_EXIT("INVALID PORT");
				 }
				 break;
		case 'i':if (i) { USAGE(); }
				 i++;
				 i_index = strdup(optarg);
				 break;
		default:
			USAGE();
		}
	}

	if ((rootDoc = argv[optind]) == NULL) {
		USAGE();
	}
	if (-1==access(rootDoc, R_OK)) {
		ERROR_EXIT("root doc can't be read from");
	}


	struct addrinfo hints, *ai;
	memset(&hints, 0, sizeof(hints));
	hints.ai_family = AF_INET;
	hints.ai_socktype = SOCK_STREAM;
	hints.ai_flags = AI_PASSIVE;

	int res = getaddrinfo(NULL, p_port, &hints, &ai);
	if (res != 0) {
		freeaddrinfo(ai);
		ERROR_EXIT("getAddressInfo");
	}

	int sock_fd = socket(ai->ai_family, ai->ai_socktype, ai->ai_protocol);
	if (sock_fd < 0) {
		freeaddrinfo(ai);
		ERROR_EXIT("socket");
	}

	//int optval = 1;
	//setsockopt(sock_fd, SOL_SOCKET, SO_REUSEADDR, &optval, sizeof optval);

	if (bind(sock_fd, ai->ai_addr, ai->ai_addrlen) < 0) {
		freeaddrinfo(ai);
		ERROR_EXIT("bind");
	}

	if (listen(sock_fd, 10) < 0) {
		freeaddrinfo(ai);
		ERROR_EXIT("listen");
	}

	fprintf(stderr,"http://localhost:%s ...\n", p_port);
	setupSignalHandler();

	startRequestHandling(sock_fd,rootDoc,i_index);
	freeaddrinfo(ai);

	return 0;
}